

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::ScanNodes(BasePort *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  ulong uVar7;
  ushort uVar8;
  ulong uVar9;
  char *pcVar10;
  ushort uVar11;
  ulong uVar12;
  quadlet_t data;
  uint32_t git_desc;
  ulong local_88;
  ulong local_80;
  ostream *local_78;
  string local_70;
  string local_50;
  
  builtin_memcpy(this->Node2Board,
                 "\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10"
                 ,0x40);
  this->IsAllBoardsBroadcastCapable_ = true;
  this->IsAllBoardsRev4_5_ = true;
  this->IsAllBoardsRev4_6_ = true;
  this->IsAllBoardsRev6_ = true;
  this->IsAllBoardsRev7_ = true;
  this->IsAllBoardsRev8_9_ = true;
  this->NumOfNodes_ = 0;
  iVar4 = (*this->_vptr_BasePort[2])();
  poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: building node map for ");
  uVar8 = (ushort)iVar4;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar8);
  poVar6 = std::operator<<(poVar6," nodes:");
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar12 = 0;
  do {
    if (uVar8 == uVar12) {
      poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: found ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," boards");
      std::endl<char,std::char_traits<char>>(poVar6);
      for (uVar12 = 0; uVar12 != 0x10; uVar12 = uVar12 + 1) {
        this->Board2Node[uVar12] = 0x40;
        uVar7 = 0x40;
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          if (uVar12 == this->Node2Board[uVar9]) {
            if ((ushort)uVar7 < 0x40) {
              poVar6 = std::operator<<(this->outStr,
                                       "BasePort::ScanNodes: warning: duplicate node id for board ")
              ;
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              poVar6 = std::operator<<(poVar6,"(");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->Board2Node[uVar12]);
              poVar6 = std::operator<<(poVar6,", ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ushort)uVar9);
              poVar6 = std::operator<<(poVar6,")");
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            uVar7 = uVar9 & 0xffffffff;
            this->Board2Node[uVar12] = (ushort)uVar9;
          }
        }
      }
      return this->NumOfNodes_ != 0;
    }
    uVar11 = (ushort)uVar12;
    iVar4 = (*this->_vptr_BasePort[4])(this,uVar12 & 0xffff,4,&data,0);
    if ((char)iVar4 == '\0') {
      iVar4 = (*this->_vptr_BasePort[0xf])(this);
      if (iVar4 == 0) {
        poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: unable to read from node ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar11);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    else {
      uVar7 = (ulong)data;
      bVar3 = HardwareVersionValid(uVar7);
      if (bVar3) {
        iVar4 = (*this->_vptr_BasePort[4])(this,uVar12 & 0xffff,7,&data);
        if ((char)iVar4 == '\0') {
          poVar6 = this->outStr;
          pcVar10 = "BasePort::ScanNodes: unable to read firmware version from node ";
        }
        else {
          local_80 = (ulong)data;
          uVar5 = 1;
          if (4 < local_80) {
            iVar4 = (*this->_vptr_BasePort[4])(this,uVar12 & 0xffff,0xc,&data);
            if ((char)iVar4 == '\0') {
              poVar6 = this->outStr;
              pcVar10 = "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node ";
              goto LAB_0010ac4c;
            }
            uVar5 = BoardIO::GetFpgaVersionMajorFromStatus(data);
          }
          iVar4 = (*this->_vptr_BasePort[4])(this,uVar12 & 0xffff,0,&data);
          if ((char)iVar4 != '\0') {
            local_88 = (ulong)(data >> 0x18 & 0xf);
            this->FpgaVersion[local_88] = uVar5;
            this->HardwareVersion[local_88] = uVar7;
            this->FirmwareVersion[local_88] = local_80;
            git_desc = 0;
            iVar4 = (*this->_vptr_BasePort[4])(this,uVar12 & 0xffff,0xf,&git_desc);
            if ((char)iVar4 == '\0') {
              poVar6 = std::operator<<(this->outStr,
                                       "BasePort::ScanNodes: unable to read git desc from node ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar11);
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            poVar6 = std::operator<<(this->outStr,"  Node ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar11);
            poVar6 = std::operator<<(poVar6,", BoardId = ");
            uVar7 = local_88;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            local_78 = std::operator<<(poVar6,", ");
            GetFpgaVersionMajorString_abi_cxx11_(&local_70,this,(uchar)uVar7);
            poVar6 = std::operator<<(local_78,(string *)&local_70);
            poVar6 = std::operator<<(poVar6,", Hardware = ");
            GetHardwareVersionString_abi_cxx11_(&local_50,this,(uchar)local_88);
            poVar6 = std::operator<<(poVar6,(string *)&local_50);
            poVar6 = std::operator<<(poVar6,", Firmware Version = ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
            if (git_desc != 0) {
              uVar5 = git_desc & 8;
              pcVar10 = "-";
              if ((git_desc & 3) != 1) {
                if ((git_desc & 3) == 0) {
                  pcVar10 = "+";
                  if ((git_desc >> 2 & 1) == 0 && uVar5 == 0) goto LAB_0010ad06;
                }
                else {
                  pcVar10 = "?";
                }
              }
              std::operator<<(this->outStr,pcVar10);
              poVar6 = std::operator<<(this->outStr," (git-");
              lVar1 = *(long *)poVar6;
              lVar2 = *(long *)(lVar1 + -0x18);
              *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
              *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
              poVar6 = std::operator<<(poVar6,0x30);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
                   *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
              if (uVar5 != 0) {
                std::operator<<(this->outStr,"*");
              }
              std::operator<<(this->outStr,")");
            }
LAB_0010ad06:
            std::endl<char,std::char_traits<char>>(this->outStr);
            if (this->Node2Board[uVar12] < 0x10) {
              poVar6 = std::operator<<(this->outStr,"    Duplicate entry, previous value = ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)this->Node2Board[uVar12]);
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            this->Node2Board[uVar12] = (uchar)local_88;
            uVar5 = (uint)local_80;
            if (uVar5 < 4) {
              this->IsAllBoardsBroadcastCapable_ = false;
              this->IsAllBoardsRev4_5_ = false;
              this->IsAllBoardsRev4_6_ = false;
LAB_0010ad8f:
              this->IsAllBoardsRev6_ = false;
LAB_0010ad93:
              this->IsAllBoardsRev7_ = false;
LAB_0010ad97:
              this->IsAllBoardsRev8_9_ = false;
            }
            else {
              if (uVar5 < 6) goto LAB_0010ad8f;
              this->IsAllBoardsRev4_5_ = false;
              if (uVar5 == 6) goto LAB_0010ad93;
              this->IsAllBoardsRev4_6_ = false;
              this->IsAllBoardsRev6_ = false;
              if ((uVar5 == 7) || (this->IsAllBoardsRev7_ = false, uVar5 - 10 < 0xfffffffe))
              goto LAB_0010ad97;
            }
            this->NumOfNodes_ = this->NumOfNodes_ + 1;
            goto LAB_0010ac69;
          }
          poVar6 = this->outStr;
          pcVar10 = "BasePort::ScanNodes: unable to read status from node ";
        }
LAB_0010ac4c:
        poVar6 = std::operator<<(poVar6,pcVar10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar11);
      }
      else {
        poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: node ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar11);
        poVar6 = std::operator<<(poVar6," is not a supported board (data = ");
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar6 = std::operator<<(poVar6,")");
      }
      std::endl<char,std::char_traits<char>>(poVar6);
    }
LAB_0010ac69:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

bool BasePort::ScanNodes(void)
{
    unsigned int board;
    nodeid_t node;

    // Clear any existing Node2Board
    memset(Node2Board, BoardIO::MAX_BOARDS, sizeof(Node2Board));

    IsAllBoardsBroadcastCapable_ = true;
    IsAllBoardsRev4_5_ = true;
    IsAllBoardsRev4_6_ = true;
    IsAllBoardsRev6_ = true;
    IsAllBoardsRev7_ = true;
    IsAllBoardsRev8_9_ = true;
    NumOfNodes_ = 0;

    nodeid_t max_nodes = InitNodes();

    outStr << "BasePort::ScanNodes: building node map for " << max_nodes << " nodes:" << std::endl;
    // Iterate through all possible nodes
    for (node = 0; node < max_nodes; node++) {
        quadlet_t data;
        unsigned long hver = 0;
        // check hardware version
        if (!ReadQuadletNode(node, BoardIO::HARDWARE_VERSION, data)) {
            if (GetPortType() == PORT_FIREWIRE)
                outStr << "BasePort::ScanNodes: unable to read from node " << node << std::endl;
            continue;
        }
        hver = data;

        if (!HardwareVersionValid(hver)) {
            outStr << "BasePort::ScanNodes: node " << node << " is not a supported board (data = "
                   << std::hex << data << std::dec << ")" << std::endl;
            continue;
        }

        // read firmware version
        unsigned long fver = 0;
        if (!ReadQuadletNode(node, BoardIO::FIRMWARE_VERSION, data)) {
            outStr << "BasePort::ScanNodes: unable to read firmware version from node "
                   << node << std::endl;
            continue;
        }
        fver = data;

        // read FPGA version (for Firmware Rev 5+)
        unsigned long fpga_ver = 1;
        if (fver >= 5) {
            if (!ReadQuadletNode(node, BoardIO::ETH_STATUS, data)) {
                outStr << "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node "
                       << node << std::endl;
                continue;
            }
            fpga_ver = BoardIO::GetFpgaVersionMajorFromStatus(data);
        }

        // read board id
        if (!ReadQuadletNode(node, BoardIO::BOARD_STATUS, data)) {
            outStr << "BasePort::ScanNodes: unable to read status from node " << node << std::endl;
            continue;
        }
        // board_id is bits 27-24, BOARD_ID_MASK = 0x0F000000
        board = (data & BOARD_ID_MASK) >> 24;
        FpgaVersion[board] = fpga_ver;
        HardwareVersion[board] = hver;
        FirmwareVersion[board] = fver;

        // read git description (introduced after Rev 8 release)
        uint32_t git_desc = 0;
        if (!ReadQuadletNode(node, BoardIO::GIT_DESC, git_desc)) {
            outStr << "BasePort::ScanNodes: unable to read git desc from node " << node << std::endl;
        }
        outStr << "  Node " << node << ", BoardId = " << board
               << ", " << GetFpgaVersionMajorString(board)
               << ", Hardware = " << GetHardwareVersionString(board)
               << ", Firmware Version = " << GetFirmwareVersion(board);

        if (git_desc != 0) {
            // git_dirty bit indicates that firmware was built with uncommitted changes;
            // shown by appending * to the git SHA.
            bool git_dirty = git_desc&0x00000008;
            // git_commits bit indicates whether there were any commits since the last tag
            bool git_commits = git_desc&0x00000004;
            // git_flag is set by the firmware, based on comparing the firmware version (F) to
            // the most recent git tag ("RevG", where G is the git tag version)
            //    0:  F == G     actual release ("F") or update to last release ("F+"),
            //                   depending on git_dirty and git_commits
            //    1:  F == G+1   new firmware preview, shown as "F-"
            //    2:  F > G+1    should not happen (missing git tag?), shown as "F?"
            //    3:  F < G      should not happen, shown as "F?"
            uint8_t git_flag = git_desc&0x00000003;
            bool showSHA = true;
            if (git_flag == 0) {
                if (git_dirty|git_commits)
                    outStr << "+";
                else
                    showSHA = false;
            }
            else if (git_flag == 1)
                outStr << "-";
            else
                outStr << "?";
            if (showSHA) {
                outStr << " (git-" << std::hex << std::setw(7) << std::setfill('0')
                       << (git_desc>>4) << std::dec;
                if (git_dirty)
                    outStr << "*";
                outStr << ")";
            }
        }
        outStr << std::endl;

        if (Node2Board[node] < BoardIO::MAX_BOARDS) {
            outStr << "    Duplicate entry, previous value = "
                   << static_cast<int>(Node2Board[node]) << std::endl;
        }
        Node2Board[node] = static_cast<unsigned char>(board);

        // check firmware version
        // Firmware Version >= 4, broadcast capable
        if (fver < 4) {
            IsAllBoardsBroadcastCapable_ = false;
            IsAllBoardsRev4_5_ = false;
            IsAllBoardsRev4_6_ = false;
        }
        if (fver > 5) IsAllBoardsRev4_5_ = false;
        if (fver > 6) IsAllBoardsRev4_6_ = false;
        // Firmware Version 6, broadcast with possibly shorter wait (i.e., skipping nodes
        // on the bus that are not part of the current configuration).
        if (fver != 6) IsAllBoardsRev6_ = false;
        // Firmware Version 7, added power control to block write; added velocity estimation
        // fields to block read
        if (fver != 7) IsAllBoardsRev7_ = false;
        // Firmware Version 8, added header quadlet to block write; support larger entries in
        // block read (both changes to support dRAC).
        if ((fver != 8) && (fver != 9)) IsAllBoardsRev8_9_ = false;
        NumOfNodes_++;
    }
    outStr << "BasePort::ScanNodes: found " << NumOfNodes_ << " boards" << std::endl;

    // update Board2Node
    for (board = 0; board < BoardIO::MAX_BOARDS; board++) {
        Board2Node[board] = MAX_NODES;
        // search up to max_nodes (not NumOfNodes_) in case nodes are not sequential (i.e., if some nodes
        // are not associated with valid boards).
        for (node = 0; node < max_nodes; node++) {
            if (Node2Board[node] == board) {
                if (Board2Node[board] < MAX_NODES)
                    outStr << "BasePort::ScanNodes: warning: duplicate node id for board " << board
                           << "(" << Board2Node[board] << ", " << node << ")" << std::endl;
                Board2Node[board] = node;
            }
        }
    }

    return (NumOfNodes_ > 0);
}